

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  LodePNGState state;
  uint error;
  LodePNGState *this;
  uchar *in_stack_fffffffffffffe18;
  LodePNGState *in_stack_fffffffffffffe20;
  _func_int **in_stack_fffffffffffffe28;
  uint *in_stack_fffffffffffffe30;
  uchar **in_stack_fffffffffffffe38;
  
  this = (LodePNGState *)&stack0xfffffffffffffe28;
  LodePNGState::LodePNGState(this);
  lodepng_state_init((LodePNGState *)0x11eb97);
  uVar1 = lodepng_decode(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         (uint *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18,(size_t)this);
  lodepng_state_cleanup((LodePNGState *)0x11ec02);
  LodePNGState::~LodePNGState((LodePNGState *)&stack0xfffffffffffffe28);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
	size_t insize, LodePNGColorType colortype, unsigned bitdepth)
{
	unsigned error;
	LodePNGState state;
	lodepng_state_init(&state);
	state.info_raw.colortype = colortype;
	state.info_raw.bitdepth = bitdepth;
	error = lodepng_decode(out, w, h, &state, in, insize);
	lodepng_state_cleanup(&state);
	return error;
}